

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqGrNode.cc
# Opt level: O2

void * EqGrNode::bsearch(void *__key,void *__base,size_t __nmemb,size_t __size,
                        __compar_fn_t __compar)

{
  FreqIt *this;
  __shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var1;
  __shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  void *pvVar6;
  ulong uVar7;
  __shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_50;
  __shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  
  uVar7 = (long)((int)__base + (int)__key) / 2;
  if ((int)__base < (int)__key) {
    uVar7 = 0xffffffffffffffff;
  }
  else {
    iVar3 = (int)uVar7;
    uVar7 = uVar7 & 0xffffffff;
    pvVar5 = std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>::at
                       (*(vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>
                          **)__nmemb,(long)iVar3);
    this = (pvVar5->super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,(__shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2> *)__size);
    iVar4 = FreqIt::compare(this,(FreqIt_S *)&local_60,(int)__compar);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    if (iVar4 != 0) {
      if (iVar4 < 0) {
        p_Var1 = &local_40;
        std::
        __shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_40,
                       (__shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        *)__nmemb);
        std::__shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_70,(__shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2> *)__size);
        pvVar6 = bsearch((void *)((ulong)__key & 0xffffffff),(void *)(ulong)(iVar3 - 1),
                         (size_t)&local_40,(size_t)&local_70,
                         (__compar_fn_t)((ulong)__compar & 0xffffffff));
        p_Var2 = &local_70;
      }
      else {
        p_Var1 = &local_50;
        std::
        __shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_50,
                       (__shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        *)__nmemb);
        std::__shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_80,(__shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2> *)__size);
        pvVar6 = bsearch((void *)(ulong)(iVar3 + 1),(void *)((ulong)__base & 0xffffffff),
                         (size_t)&local_50,(size_t)&local_80,
                         (__compar_fn_t)((ulong)__compar & 0xffffffff));
        p_Var2 = &local_80;
      }
      uVar7 = (ulong)pvVar6 & 0xffffffff;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var2->_M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
    }
  }
  return (void *)(uVar7 & 0xffffffff);
}

Assistant:

int EqGrNode::bsearch(int min, int max, FreqIt_SS freqArray, FreqIt_S fit, int recursive) {
    int mid = (max + min) / 2;
    if (max < min) return -1;

    int res = freqArray->at(mid)->compare(fit, recursive);
    if (res == 0) return mid;
    else if (res < 0) return bsearch(min, mid - 1, freqArray, fit, recursive);
    else return bsearch(mid + 1, max, freqArray, fit, recursive);
}